

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::operator==(Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *a,Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_t __n;
  int iVar3;
  bool bVar4;
  
  pbVar1 = a->nullableValue;
  bVar4 = true;
  if (b->nullableValue != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      || pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (((pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
        (pbVar2 = b->nullableValue,
        pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) ||
       (__n = pbVar1->_M_string_length, __n != pbVar2->_M_string_length)) {
      return false;
    }
    if (__n != 0) {
      iVar3 = bcmp((pbVar1->_M_dataplus)._M_p,(pbVar2->_M_dataplus)._M_p,__n);
      bVar4 = iVar3 == 0;
    }
  }
  return bVar4;
}

Assistant:

bool some() const { return nullableValue != nullptr; }